

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mstring.c
# Opt level: O0

int mputchar(mstring *s,int ch)

{
  int iVar1;
  char *pcVar2;
  int len;
  int ch_local;
  mstring *s_local;
  
  if ((s != (mstring *)0x0) && (s->base != (char *)0x0)) {
    if (s->ptr == s->end) {
      iVar1 = (int)s->end - (int)s->base;
      pcVar2 = (char *)realloc(s->base,(long)(iVar1 * 2 + 8));
      s->base = pcVar2;
      if (pcVar2 == (char *)0x0) {
        s->end = (char *)0x0;
        s->ptr = (char *)0x0;
        return ch;
      }
      s->ptr = s->base + iVar1;
      s->end = s->base + (long)iVar1 + (long)iVar1 + 8;
    }
    pcVar2 = s->ptr;
    s->ptr = pcVar2 + 1;
    *pcVar2 = (char)ch;
  }
  return ch;
}

Assistant:

int mputchar(struct mstring *s, int ch)
{
    if (!s || !s->base) return ch;
    if (s->ptr == s->end) {
	int len = s->end - s->base;
	if ((s->base = realloc(s->base, len+len+TAIL))) {
	    s->ptr = s->base + len;
	    s->end = s->base + len+len+TAIL; }
	else {
	    s->ptr = s->end = 0;
	    return ch; } }
    *s->ptr++ = ch;
    return ch;
}